

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xbox.cpp
# Opt level: O0

void * rw::xbox::createNativeRaster(void *object,int32 offset,int32 param_3)

{
  undefined8 *puVar1;
  XboxRaster *raster;
  int32 param_2_local;
  int32 offset_local;
  void *object_local;
  
  puVar1 = (undefined8 *)((long)object + (long)offset);
  *puVar1 = 0;
  puVar1[1] = 0;
  *(undefined4 *)(puVar1 + 2) = 0;
  *(undefined1 *)(puVar1 + 3) = 0;
  *(undefined1 *)((long)puVar1 + 0x19) = 0;
  *(undefined4 *)((long)puVar1 + 0x1c) = 0;
  return object;
}

Assistant:

static void*
createNativeRaster(void *object, int32 offset, int32)
{
	XboxRaster *raster = PLUGINOFFSET(XboxRaster, object, offset);
	raster->texture = nil;
	raster->palette = nil;
	raster->format = 0;
	raster->hasAlpha = 0;
	raster->customFormat = 0;
	raster->unknownFlag = 0;
	return object;
}